

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  bool bVar1;
  string *output;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages;
  OneofOptions *options;
  FieldDescriptorProto *this_01;
  allocator local_6d;
  int32_t local_6c;
  DescriptorProto *local_68;
  LocationRecorder name_location;
  
  local_6c = oneof_index;
  local_68 = containing_type;
  bVar1 = Consume(this,"oneof");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&name_location,oneof_location,1);
    output = OneofDescriptorProto::_internal_mutable_name_abi_cxx11_(oneof_decl);
    bVar1 = ConsumeIdentifier(this,output,"Expected oneof name.");
    LocationRecorder::~LocationRecorder(&name_location);
    if ((bVar1) && (bVar1 = ConsumeEndOfDeclaration(this,"{",oneof_location), bVar1)) {
      this_00 = &local_68->field_;
      messages = &local_68->nested_type_;
      while ((this->input_->current_).type != TYPE_END) {
        bVar1 = LookingAt(this,"option");
        if (bVar1) {
          LocationRecorder::LocationRecorder(&name_location,oneof_location,2);
          options = OneofDescriptorProto::_internal_mutable_options(oneof_decl);
          bVar1 = ParseOption(this,&options->super_Message,&name_location,containing_file,
                              OPTION_STATEMENT);
          LocationRecorder::~LocationRecorder(&name_location);
          if (!bVar1) {
            return false;
          }
        }
        else {
          bVar1 = LookingAt(this,"required");
          if (((bVar1) || (bVar1 = LookingAt(this,"optional"), bVar1)) ||
             (bVar1 = LookingAt(this,"repeated"), bVar1)) {
            std::__cxx11::string::string
                      ((string *)&name_location,
                       "Fields in oneofs must not have labels (required / optional / repeated).",
                       &local_6d);
            AddError(this,(string *)&name_location);
            std::__cxx11::string::~string((string *)&name_location);
            io::Tokenizer::Next(this->input_);
          }
          LocationRecorder::LocationRecorder
                    (&name_location,containing_type_location,2,
                     (local_68->field_).super_RepeatedPtrFieldBase.current_size_);
          this_01 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(this_00);
          FieldDescriptorProto::_internal_set_label
                    (this_01,FieldDescriptorProto_Label_LABEL_OPTIONAL);
          *(byte *)(this_01->_has_bits_).has_bits_ = (byte)(this_01->_has_bits_).has_bits_[0] | 0x80
          ;
          this_01->oneof_index_ = local_6c;
          bVar1 = ParseMessageFieldNoLabel
                            (this,this_01,messages,containing_type_location,3,&name_location,
                             containing_file);
          if (!bVar1) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&name_location);
        }
        bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
        if (bVar1) {
          return true;
        }
      }
      std::__cxx11::string::string
                ((string *)&name_location,
                 "Reached end of input in oneof definition (missing \'}\').",&local_6d);
      AddError(this,(string *)&name_location);
      std::__cxx11::string::~string((string *)&name_location);
    }
  }
  return false;
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type, int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      AddError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") || LookingAt("optional") ||
        LookingAt("repeated")) {
      AddError(
          "Fields in oneofs must not have labels (required / optional "
          "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field, containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}